

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Utils.h
# Opt level: O1

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::fixupL
          (SparseLUImpl<double,_int> *this,int n,IndexVector *perm_r,GlobalLU_t *glu)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  
  if ((-1 < n) &&
     (lVar12 = (long)n,
     lVar12 < (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows)) {
    uVar1 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[lVar12];
    if ((int)uVar1 < 0) {
      iVar13 = 0;
    }
    else {
      piVar4 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar5 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      lVar6 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      lVar18 = 0;
      lVar15 = 0;
      if (0 < lVar5) {
        lVar15 = lVar5;
      }
      lVar16 = 1;
      if (1 < lVar5) {
        lVar16 = lVar5;
      }
      piVar7 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      iVar13 = 0;
      do {
        if (lVar18 == lVar15) goto LAB_00151189;
        uVar2 = piVar4[lVar18];
        lVar19 = (long)(int)uVar2;
        if ((lVar19 < 0) || (lVar6 <= lVar19)) goto LAB_00151189;
        iVar3 = piVar7[lVar19];
        lVar11 = (long)iVar3;
        piVar7[lVar19] = iVar13;
        lVar19 = (ulong)uVar2 + 1;
        if (lVar6 <= lVar19) goto LAB_00151189;
        piVar8 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        lVar9 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        piVar10 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        lVar14 = (long)iVar13;
        while (lVar11 < piVar7[(ulong)uVar2 + 1]) {
          if ((iVar3 < 0) || (lVar9 <= lVar11)) goto LAB_00151189;
          lVar17 = (long)piVar8[lVar11];
          if ((lVar17 < 0) ||
             ((perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= lVar17)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                         );
          }
          if ((iVar13 < 0) || (lVar9 <= lVar14)) goto LAB_00151189;
          piVar8[lVar14] = piVar10[lVar17];
          lVar14 = lVar14 + 1;
          lVar11 = lVar11 + 1;
          if (lVar6 <= lVar19) goto LAB_00151189;
        }
        if (lVar18 == lVar16 + -1) goto LAB_00151189;
        iVar13 = (int)lVar14;
        lVar18 = lVar18 + 1;
        uVar20 = (ulong)(uVar2 + 1);
        while ((int)uVar20 < piVar4[lVar18]) {
          if (lVar6 <= (long)uVar20) goto LAB_00151189;
          piVar7[uVar20] = iVar13;
          uVar20 = uVar20 + 1;
          if (lVar5 <= lVar18) goto LAB_00151189;
        }
      } while (lVar18 != (ulong)uVar1 + 1);
    }
    if (lVar12 < (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
      (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar12] = iVar13;
      return;
    }
  }
LAB_00151189:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
               );
}

Assistant:

void SparseLUImpl<Scalar,Index>::fixupL(const Index n, const IndexVector& perm_r, GlobalLU_t& glu)
{
  Index fsupc, i, j, k, jstart; 
  
  Index nextl = 0; 
  Index nsuper = (glu.supno)(n); 
  
  // For each supernode 
  for (i = 0; i <= nsuper; i++)
  {
    fsupc = glu.xsup(i); 
    jstart = glu.xlsub(fsupc); 
    glu.xlsub(fsupc) = nextl; 
    for (j = jstart; j < glu.xlsub(fsupc + 1); j++)
    {
      glu.lsub(nextl) = perm_r(glu.lsub(j)); // Now indexed into P*A
      nextl++;
    }
    for (k = fsupc+1; k < glu.xsup(i+1); k++)
      glu.xlsub(k) = nextl; // other columns in supernode i
  }
  
  glu.xlsub(n) = nextl; 
}